

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O2

bool __thiscall
MADPComponentFactoredStates::SetInitialized(MADPComponentFactoredStates *this,bool b)

{
  uint uVar1;
  size_t *psVar2;
  reference pvVar3;
  FSDist_COF *this_00;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,b) != 0) {
    if (this->_m_initialized != false) {
      return b;
    }
    psVar2 = IndexTools::CalculateStepSize(&this->_m_sfacDomainSizes);
    this->_m_stepSize = psVar2;
    this->_m_nrStates = 1;
    for (uVar1 = 0; (ulong)uVar1 < this->_m_nrStateFactors; uVar1 = uVar1 + 1) {
      pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->_m_sfacDomainSizes,(ulong)uVar1);
      this->_m_nrStates = this->_m_nrStates * *pvVar3;
    }
    this_00 = (FSDist_COF *)operator_new(0x48);
    FSDist_COF::FSDist_COF(this_00,this);
    this->_m_initialStateDistribution = (FactoredStateDistribution *)this_00;
  }
  this->_m_initialized = b;
  return b;
}

Assistant:

bool MADPComponentFactoredStates::SetInitialized(bool b)
{

    if(b == true)
    {
        if(_m_initialized)
            //already initialized: just return
            return true;

        _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
        _m_nrStates = 1;
        for(Index i=0;i<_m_nrStateFactors;i++)
            _m_nrStates *= _m_sfacDomainSizes.at(i);



        _m_initialStateDistribution = new FSDist_COF(*this);

#if 0 && DEBUG_MCFS
        PrintDebugStuff();
#endif    

    }
    
    _m_initialized = b;
    return b;
}